

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fTextureStateQueryTests.cpp
# Opt level: O1

void __thiscall deqp::gles2::Functional::anon_unknown_2::TextureCase::test(TextureCase *this)

{
  CallLogWrapper *this_00;
  GLuint textureId;
  GLuint local_1c;
  
  local_1c = 0;
  this_00 = &(this->super_ApiCase).super_CallLogWrapper;
  glu::CallLogWrapper::glGenTextures(this_00,1,&local_1c);
  glu::CallLogWrapper::glBindTexture(this_00,this->m_textureTarget,local_1c);
  ApiCase::expectError(&this->super_ApiCase,0);
  (*(this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode[6])(this);
  glu::CallLogWrapper::glDeleteTextures(this_00,1,&local_1c);
  ApiCase::expectError(&this->super_ApiCase,0);
  return;
}

Assistant:

void test (void)
	{
		GLuint textureId = 0;
		glGenTextures(1, &textureId);
		glBindTexture(m_textureTarget, textureId);
		expectError(GL_NO_ERROR);

		testTexture();

		glDeleteTextures(1, &textureId);
		expectError(GL_NO_ERROR);
	}